

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool str_to_uint32_t(char *s,uint32_t *out)

{
  ulong uVar1;
  unsigned_long converted;
  char *endptr;
  uint32_t *out_local;
  char *s_local;
  
  endptr = (char *)out;
  out_local = (uint32_t *)s;
  uVar1 = strtoul(s,(char **)&converted,10);
  if ((((char)*out_local == '\0') || (*(char *)converted != '\0')) || (0xffffffff < uVar1)) {
    s_local._7_1_ = false;
  }
  else {
    *(int *)endptr = (int)uVar1;
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool str_to_uint32_t(const char *s, uint32_t *out)
{
    char *endptr;
    unsigned long converted = strtoul(s, &endptr, 10);
    if (*s && !*endptr && converted <= ~(uint32_t)0) {
        *out = converted;
        return true;
    } else {
        return false;
    }
}